

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O3

void __thiscall QTuioHandler::process2DCurSet(QTuioHandler *this,QOscMessage *message)

{
  QVariant *pQVar1;
  long lVar2;
  QDebug QVar3;
  int iVar4;
  iterator iVar5;
  long in_FS_OFFSET;
  float x;
  float y;
  float fVar6;
  float fVar7;
  float fVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  int cursorId;
  int local_a4 [7];
  char *local_88;
  QDebug local_80;
  QDebug local_78;
  QtPrivate local_70 [8];
  undefined1 local_68 [16];
  ulong local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = (message->m_arguments).d.d;
  pQVar1 = (message->m_arguments).d.ptr;
  local_58 = (message->m_arguments).d.size;
  if ((Data *)local_68._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_68._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_68._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  local_68._8_8_ = pQVar1;
  if (local_58 < 7) {
    lcTuioSet();
    if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      process2DCurSet((QTuioHandler *)&local_58);
    }
  }
  else {
    iVar4 = QVariant::typeId(pQVar1 + 1);
    if (iVar4 == 2) {
      iVar4 = QVariant::typeId(pQVar1 + 2);
      if (iVar4 == 0x26) {
        iVar4 = QVariant::typeId(pQVar1 + 3);
        if (iVar4 == 0x26) {
          iVar4 = QVariant::typeId(pQVar1 + 4);
          if (iVar4 == 0x26) {
            iVar4 = QVariant::typeId(pQVar1 + 5);
            if (iVar4 == 0x26) {
              iVar4 = QVariant::typeId(pQVar1 + 6);
              if (iVar4 == 0x26) {
                local_a4[0] = QVariant::toInt((bool *)(pQVar1 + 1));
                x = (float)QVariant::toFloat((bool *)(pQVar1 + 2));
                y = (float)QVariant::toFloat((bool *)(pQVar1 + 3));
                fVar6 = (float)QVariant::toFloat((bool *)(pQVar1 + 4));
                fVar7 = (float)QVariant::toFloat((bool *)(pQVar1 + 5));
                fVar8 = (float)QVariant::toFloat((bool *)(pQVar1 + 6));
                iVar5 = QMap<int,_QTuioCursor>::find
                                  ((QMap<int,_QTuioCursor> *)(this + 0x28),local_a4);
                QMap<int,_QTuioCursor>::detach((QMap<int,_QTuioCursor> *)(this + 0x28));
                lVar2 = *(long *)(this + 0x28);
                lcTuioSet();
                if (iVar5.i._M_node == (_Base_ptr)(lVar2 + 0x10)) {
                  if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i
                      & 1) != 0) {
                    process2DCurSet((QTuioHandler *)local_a4);
                  }
                }
                else {
                  if (((byte)lcTuioSet::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
                      1) != 0) {
                    local_a4[1] = 2;
                    local_a4[2] = 0;
                    local_a4[3] = 0;
                    local_a4[4] = 0;
                    local_a4[5] = 0;
                    local_a4[6] = 0;
                    local_88 = lcTuioSet::category.name;
                    QMessageLogger::debug();
                    QVar3.stream = local_80.stream;
                    QVar9.m_data = (storage_type *)0x13;
                    QVar9.m_size = (qsizetype)&local_50;
                    QString::fromUtf8(QVar9);
                    QTextStream::operator<<((QTextStream *)QVar3.stream,&local_50);
                    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_50.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
                      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
                    }
                    QTextStream::operator<<((QTextStream *)local_80.stream,local_a4[0]);
                    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
                      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
                    }
                    QVar3.stream = local_80.stream;
                    QVar10.m_data = (storage_type *)0x4;
                    QVar10.m_size = (qsizetype)&local_50;
                    QString::fromUtf8(QVar10);
                    QTextStream::operator<<((QTextStream *)QVar3.stream,&local_50);
                    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_50.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
                      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
                    }
                    QTextStream::operator<<((QTextStream *)local_80.stream,x);
                    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
                      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
                    }
                    QTextStream::operator<<((QTextStream *)local_80.stream,y);
                    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
                      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
                    }
                    QTextStream::operator<<((QTextStream *)local_80.stream,fVar6);
                    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
                      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
                    }
                    QTextStream::operator<<((QTextStream *)local_80.stream,fVar7);
                    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
                      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
                    }
                    QTextStream::operator<<((QTextStream *)local_80.stream,fVar8);
                    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
                      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
                    }
                    QDebug::~QDebug(&local_80);
                  }
                  QTuioCursor::setX((QTuioCursor *)((long)iVar5.i._M_node + 0x24),x);
                  QTuioCursor::setY((QTuioCursor *)((long)iVar5.i._M_node + 0x24),y);
                  *(float *)((long)iVar5.i._M_node + 0x30) = fVar6;
                  *(float *)((long)iVar5.i._M_node + 0x34) = fVar7;
                  *(float *)((long)iVar5.i._M_node + 0x38) = fVar8;
                }
                goto LAB_0010a401;
              }
            }
          }
        }
      }
    }
    lcTuioSet();
    if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_a4[1] = 2;
      local_a4[2] = 0;
      local_a4[3] = 0;
      local_a4[4] = 0;
      local_a4[5] = 0;
      local_a4[6] = 0;
      local_88 = lcTuioSet::category.name;
      QMessageLogger::warning();
      QVar3.stream = local_80.stream;
      QVar11.m_data = (storage_type *)0x34;
      QVar11.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<((QTextStream *)QVar3.stream,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      *(int *)((QTextStream *)local_80.stream + 0x28) =
           *(int *)((QTextStream *)local_80.stream + 0x28) + 1;
      local_78.stream = (Stream *)0x0;
      QtPrivate::printSequentialContainer<QList<QVariant>>
                (local_70,(Stream *)&local_50,"QList",(QList<QVariant> *)local_68);
      QDebug::~QDebug((QDebug *)&local_50);
      QDebug::~QDebug((QDebug *)local_70);
      QDebug::~QDebug(&local_78);
      QDebug::~QDebug(&local_80);
    }
  }
LAB_0010a401:
  QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTuioHandler::process2DCurSet(const QOscMessage &message)
{
    QList<QVariant> arguments = message.arguments();
    if (arguments.size() < 7) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with too few arguments: " << arguments.size();
        return;
    }

    if (QMetaType::Type(arguments.at(1).userType()) != QMetaType::Int   ||
        QMetaType::Type(arguments.at(2).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(3).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(4).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(5).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(6).userType()) != QMetaType::Float
       ) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with bad types: " << arguments;
        return;
    }

    int cursorId = arguments.at(1).toInt();
    float x = arguments.at(2).toFloat();
    float y = arguments.at(3).toFloat();
    float vx = arguments.at(4).toFloat();
    float vy = arguments.at(5).toFloat();
    float acceleration = arguments.at(6).toFloat();

    QMap<int, QTuioCursor>::Iterator it = m_activeCursors.find(cursorId);
    if (it == m_activeCursors.end()) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set for nonexistent cursor " << cursorId;
        return;
    }

    qCDebug(lcTuioSet) << "Processing SET for " << cursorId << " x: " << x << y << vx << vy << acceleration;
    QTuioCursor &cur = *it;
    cur.setX(x);
    cur.setY(y);
    cur.setVX(vx);
    cur.setVY(vy);
    cur.setAcceleration(acceleration);
}